

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDefs.c
# Opt level: O2

void set_roomdef(tgestate_t *state,room_t room_index,int offset,int new_byte)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = get_roomdef_shadow((int)CONCAT71(in_register_00000031,room_index),offset);
  if (-1 < (int)uVar1) {
    state->roomdef_shadow_bytes[uVar1] = (uint8_t)new_byte;
  }
  return;
}

Assistant:

void set_roomdef(tgestate_t *state,
                 room_t      room_index,
                 int         offset,
                 int         new_byte)
{
  int index;

  index = get_roomdef_shadow(room_index, offset);
  /* Allow setting of replacement bytes only. */
  if (index >= 0)
    state->roomdef_shadow_bytes[index] = new_byte;
  else
    assert("Unknown roomdef byte" == NULL);
}